

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_acs.cpp
# Opt level: O2

int DoSetMaster(AActor *self,AActor *master)

{
  TObjPtr<AActor> *pTVar1;
  uint uVar2;
  player_t *ppVar3;
  BYTE BVar4;
  bool bVar5;
  AActor *pAVar6;
  AActor *pAVar7;
  uint uVar8;
  
  if (((self->flags3).Value & 0x2000) == 0) {
    return 0;
  }
  if (master == (AActor *)0x0) {
    (self->master).field_0.p = (AActor *)0x0;
    self->FriendPlayer = '\0';
    pAVar7 = AActor::GetDefault(self);
    uVar2 = (self->flags).Value;
    uVar8 = (pAVar7->flags).Value & 0x8000000;
    (self->flags).Value = uVar8 | uVar2 & 0xf7ffffff;
    level.total_monsters =
         (uint)((uVar8 | uVar2 & 0x400000) == 0x400000) +
         (level.total_monsters - (uint)((uVar2 & 0x8400000) == 0x400000));
    pTVar1 = &self->target;
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
    if (pAVar7 != (AActor *)0x0) {
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      bVar5 = AActor::IsHostile(self,pAVar7);
      if (!bVar5) {
        (pTVar1->field_0).p = (AActor *)0x0;
      }
    }
    pTVar1 = &self->lastenemy;
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
    if (pAVar7 != (AActor *)0x0) {
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      bVar5 = AActor::IsHostile(self,pAVar7);
      if (!bVar5) {
        (pTVar1->field_0).p = (AActor *)0x0;
      }
    }
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)&self->LastHeard);
    if (pAVar7 == (AActor *)0x0) {
      return 1;
    }
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)&self->LastHeard);
    bVar5 = AActor::IsHostile(self,pAVar7);
    if (bVar5) {
      return 1;
    }
  }
  else {
    if (((master->flags3).Value & 0x2000) == 0) {
      if (master->player == (player_t *)0x0) {
        return 0;
      }
      (self->master).field_0.p = (AActor *)0x0;
      uVar2 = (self->flags).Value;
      level.total_monsters = level.total_monsters - (uint)((uVar2 & 0x8400000) == 0x400000);
      (self->flags).Value = uVar2 | 0x8000000;
      ppVar3 = master->player;
      if (ppVar3 == (player_t *)0x0) {
        BVar4 = '\0';
      }
      else {
        BVar4 = (char)((long)(ppVar3[-0x3b4b].frags + 7) / 0x2a0) + '\x01';
      }
      self->FriendPlayer = BVar4;
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)&ppVar3->attacker);
      if ((pAVar7 != (AActor *)0x0) &&
         ((((pAVar7->flags).Value & 0x8000000) == 0 ||
          (((deathmatch.Value != 0 && (pAVar7->FriendPlayer != '\0')) &&
           (pAVar7->FriendPlayer != self->FriendPlayer)))))) {
        (self->target).field_0.p = pAVar7;
        (self->LastHeard).field_0.p = pAVar7;
      }
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)&self->target);
      if (pAVar7 == master) {
        (self->target).field_0.p = (AActor *)0x0;
      }
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)&self->lastenemy);
      if (pAVar7 == master) {
        (self->lastenemy).field_0.p = (AActor *)0x0;
      }
    }
    else {
      self->FriendPlayer = '\0';
      pTVar1 = &self->master;
      (self->master).field_0.p = master;
      uVar2 = (self->flags).Value;
      uVar8 = (master->flags).Value & 0x8000000;
      (self->flags).Value = uVar8 | uVar2 & 0xf7ffffff;
      level.total_monsters =
           (uint)((uVar8 | uVar2 & 0x400000) == 0x400000) +
           (level.total_monsters - (uint)((uVar2 & 0x8400000) == 0x400000));
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      pAVar6 = GC::ReadBarrier<AActor>((AActor **)&self->target);
      if (pAVar6 == pAVar7) {
        (self->target).field_0.p = (AActor *)0x0;
      }
      pAVar7 = GC::ReadBarrier<AActor>((AActor **)pTVar1);
      pAVar6 = GC::ReadBarrier<AActor>((AActor **)&self->lastenemy);
      if (pAVar6 == pAVar7) {
        (self->lastenemy).field_0.p = (AActor *)0x0;
      }
      master = GC::ReadBarrier<AActor>((AActor **)pTVar1);
    }
    pAVar7 = GC::ReadBarrier<AActor>((AActor **)&self->LastHeard);
    if (pAVar7 != master) {
      return 1;
    }
  }
  (self->LastHeard).field_0.p = (AActor *)0x0;
  return 1;
}

Assistant:

int DoSetMaster (AActor *self, AActor *master)
{
    AActor *defs;
    if (self->flags3&MF3_ISMONSTER)
    {
        if (master)
        {
            if (master->flags3&MF3_ISMONSTER)
            {
                self->FriendPlayer = 0;
                self->master = master;
                level.total_monsters -= self->CountsAsKill();
                self->flags = (self->flags & ~MF_FRIENDLY) | (master->flags & MF_FRIENDLY);
                level.total_monsters += self->CountsAsKill();
                // Don't attack your new master
                if (self->target == self->master) self->target = NULL;
                if (self->lastenemy == self->master) self->lastenemy = NULL;
                if (self->LastHeard == self->master) self->LastHeard = NULL;
                return 1;
            }
            else if (master->player)
            {
                // [KS] Be friendly to this player
                self->master = NULL;
                level.total_monsters -= self->CountsAsKill();
                self->flags|=MF_FRIENDLY;
                self->SetFriendPlayer(master->player);

                AActor * attacker=master->player->attacker;
                if (attacker)
                {
                    if (!(attacker->flags&MF_FRIENDLY) || 
                        (deathmatch && attacker->FriendPlayer!=0 && attacker->FriendPlayer!=self->FriendPlayer))
                    {
                        self->LastHeard = self->target = attacker;
                    }
                }
                // And stop attacking him if necessary.
                if (self->target == master) self->target = NULL;
                if (self->lastenemy == master) self->lastenemy = NULL;
                if (self->LastHeard == master) self->LastHeard = NULL;
                return 1;
            }
        }
        else
        {
            self->master = NULL;
            self->FriendPlayer = 0;
            // Go back to whatever friendliness we usually have...
            defs = self->GetDefault();
            level.total_monsters -= self->CountsAsKill();
            self->flags = (self->flags & ~MF_FRIENDLY) | (defs->flags & MF_FRIENDLY);
            level.total_monsters += self->CountsAsKill();
            // ...And re-side with our friends.
            if (self->target && !self->IsHostile (self->target)) self->target = NULL;
            if (self->lastenemy && !self->IsHostile (self->lastenemy)) self->lastenemy = NULL;
            if (self->LastHeard && !self->IsHostile (self->LastHeard)) self->LastHeard = NULL;
            return 1;
        }
    }
    return 0;
}